

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeVectorType(Builder *this,Id component,int size)

{
  key_type kVar1;
  Id IVar2;
  uint uVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  reference ppIVar6;
  Instruction *this_00;
  mapped_type_conflict *pmVar7;
  Id local_48;
  Id local_44;
  Id debugResultId;
  key_type local_38 [4];
  Instruction *pIStack_28;
  int t;
  Instruction *type;
  int size_local;
  Id component_local;
  Builder *this_local;
  
  local_38[3] = 0;
  type._0_4_ = size;
  type._4_4_ = component;
  _size_local = this;
  while( true ) {
    kVar1 = local_38[3];
    local_38[2] = 0x17;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_38 + 2);
    sVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar4);
    if ((int)sVar5 <= (int)kVar1) {
      this_00 = (Instruction *)::operator_new(0x60);
      IVar2 = getUniqueId(this);
      spv::Instruction::Instruction(this_00,IVar2,0,OpTypeVector);
      pIStack_28 = this_00;
      spv::Instruction::reserveOperands(this_00,2);
      spv::Instruction::addIdOperand(pIStack_28,type._4_4_);
      spv::Instruction::addImmediateOperand(pIStack_28,(uint)type);
      local_38[0] = 0x17;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_38);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar4,&stack0xffffffffffffffd8);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
                 &stack0xffffffffffffffc0,pIStack_28);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)&stack0xffffffffffffffc0);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xffffffffffffffc0);
      Module::mapInstruction(&this->module,pIStack_28);
      if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
        IVar2 = makeVectorDebugType(this,type._4_4_,(uint)type);
        local_44 = IVar2;
        local_48 = spv::Instruction::getResultId(pIStack_28);
        pmVar7 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,&local_48);
        *pmVar7 = IVar2;
      }
      IVar2 = spv::Instruction::getResultId(pIStack_28);
      return IVar2;
    }
    local_38[1] = 0x17;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_38 + 1);
    ppIVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar4,(long)(int)local_38[3]);
    pIStack_28 = *ppIVar6;
    IVar2 = spv::Instruction::getIdOperand(pIStack_28,0);
    if ((IVar2 == type._4_4_) &&
       (uVar3 = spv::Instruction::getImmediateOperand(pIStack_28,1), uVar3 == (uint)type)) break;
    local_38[3] = local_38[3] + 1;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_28);
  return IVar2;
}

Assistant:

Id Builder::makeVectorType(Id component, int size)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeVector].size(); ++t) {
        type = groupedTypes[OpTypeVector][t];
        if (type->getIdOperand(0) == component &&
            type->getImmediateOperand(1) == (unsigned)size)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeVector);
    type->reserveOperands(2);
    type->addIdOperand(component);
    type->addImmediateOperand(size);
    groupedTypes[OpTypeVector].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        auto const debugResultId = makeVectorDebugType(component, size);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}